

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O0

bool __thiscall
coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::seek
          (basic_seq_coro_file<(coro_io::execution_type)1> *this,size_t offset,seekdir dir)

{
  bool bVar1;
  ulong uVar2;
  long *plVar3;
  _Ios_Seekdir in_ESI;
  long in_RDI;
  
  uVar2 = std::fstream::is_open();
  if ((uVar2 & 1) != 0) {
    plVar3 = (long *)std::istream::seekg(in_RDI + 0x30,in_ESI);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool seek(size_t offset, std::ios_base::seekdir dir) {
#if defined(ENABLE_FILE_IO_URING) || defined(ASIO_WINDOWS)
    if (async_seq_file_ && async_seq_file_->is_open()) {
      int whence = SEEK_SET;
      if (dir == std::ios_base::cur)
        whence = SEEK_CUR;
      else if (dir == std::ios_base::end)
        whence = SEEK_END;

      std::error_code seek_ec;
      async_seq_file_->seek(
          offset, static_cast<asio::file_base::seek_basis>(whence), seek_ec);
      if (seek_ec) {
        return false;
      }
      return true;
    }
#endif
    if (frw_seq_file_.is_open()) {
      if (frw_seq_file_.seekg(offset, dir)) {
        return true;
      }
    }

    return false;
  }